

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

natwm_error string_append_char(char **destination,char append)

{
  natwm_error nVar1;
  size_t sVar2;
  char *pcVar3;
  
  pcVar3 = *destination;
  sVar2 = strlen(pcVar3);
  pcVar3 = (char *)realloc(pcVar3,sVar2 + 2);
  if (pcVar3 == (char *)0x0) {
    free(*destination);
    nVar1 = MEMORY_ALLOCATION_ERROR;
  }
  else {
    *destination = pcVar3;
    pcVar3[sVar2] = append;
    pcVar3[sVar2 + 1] = '\0';
    nVar1 = NO_ERROR;
  }
  return nVar1;
}

Assistant:

natwm_error string_append_char(char **destination, char append)
{
        size_t destination_size = strlen(*destination);
        char *tmp = realloc(*destination, destination_size + 2);

        if (tmp == NULL) {
                free(*destination);

                return MEMORY_ALLOCATION_ERROR;
        }

        *destination = tmp;

        (*destination)[destination_size] = append;
        (*destination)[destination_size + 1] = '\0';

        return NO_ERROR;
}